

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O3

void __thiscall pbrt::syntactic::ParamArray<bool>::add(ParamArray<bool> *this,string *text)

{
  int iVar1;
  int iVar2;
  runtime_error *this_00;
  long *plVar3;
  long *plVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  long *local_40;
  long local_38;
  long local_30;
  long lStack_28;
  
  iVar1 = std::__cxx11::string::compare((char *)text);
  if (iVar1 != 0) {
    iVar2 = std::__cxx11::string::compare((char *)text);
    if (iVar2 != 0) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+(&local_60,"invalid value \'",text);
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_60);
      local_40 = (long *)*plVar3;
      plVar4 = plVar3 + 2;
      if (local_40 == plVar4) {
        local_30 = *plVar4;
        lStack_28 = plVar3[3];
        local_40 = &local_30;
      }
      else {
        local_30 = *plVar4;
      }
      local_38 = plVar3[1];
      *plVar3 = (long)plVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      std::runtime_error::runtime_error(this_00,(string *)&local_40);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  std::vector<bool,_std::allocator<bool>_>::push_back
            (&this->super_vector<bool,_std::allocator<bool>_>,iVar1 == 0);
  return;
}

Assistant:

void ParamArray<bool>::add(const std::string &text)
    { 
      if (text == "true")
        this->push_back(true); 
      else if (text == "false")
        this->push_back(false); 
      else
        throw std::runtime_error("invalid value '"+text+"' for bool parameter");
    }